

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucal.cpp
# Opt level: O0

int32_t ucal_getLimit_63(UCalendar *cal,UCalendarDateFields field,UCalendarLimitType type,
                        UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UCalendarLimitType type_local;
  UCalendarDateFields field_local;
  UCalendar *cal_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    cal_local._4_4_ = -1;
  }
  else {
    switch(type) {
    case UCAL_MINIMUM:
      cal_local._4_4_ = (**(code **)((long)*cal + 0x70))(cal,field);
      break;
    case UCAL_MAXIMUM:
      cal_local._4_4_ = (**(code **)((long)*cal + 0x80))(cal,field);
      break;
    case UCAL_GREATEST_MINIMUM:
      cal_local._4_4_ = (**(code **)((long)*cal + 0x90))(cal,field);
      break;
    case UCAL_LEAST_MAXIMUM:
      cal_local._4_4_ = (**(code **)((long)*cal + 0xa0))(cal,field);
      break;
    case UCAL_ACTUAL_MINIMUM:
      cal_local._4_4_ = (**(code **)((long)*cal + 0xa8))(cal,field,status);
      break;
    case UCAL_ACTUAL_MAXIMUM:
      cal_local._4_4_ = (**(code **)((long)*cal + 0xb0))(cal,field,status);
      break;
    default:
      cal_local._4_4_ = -1;
    }
  }
  return cal_local._4_4_;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
ucal_getLimit(    const    UCalendar*              cal,
              UCalendarDateFields     field,
              UCalendarLimitType      type,
              UErrorCode        *status)
{

    if(status==0 || U_FAILURE(*status)) {
        return -1;
    }

    switch(type) {
  case UCAL_MINIMUM:
      return ((Calendar*)cal)->getMinimum(field);

  case UCAL_MAXIMUM:
      return ((Calendar*)cal)->getMaximum(field);

  case UCAL_GREATEST_MINIMUM:
      return ((Calendar*)cal)->getGreatestMinimum(field);

  case UCAL_LEAST_MAXIMUM:
      return ((Calendar*)cal)->getLeastMaximum(field);

  case UCAL_ACTUAL_MINIMUM:
      return ((Calendar*)cal)->getActualMinimum(field,
          *status);

  case UCAL_ACTUAL_MAXIMUM:
      return ((Calendar*)cal)->getActualMaximum(field,
          *status);

  default:
      break;
    }
    return -1;
}